

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_workspace.cpp
# Opt level: O2

bool __thiscall ON_Workspace::KeepFile(ON_Workspace *this,FILE *pFile)

{
  if (pFile != (FILE *)0x0) {
    while (this = (ON_Workspace *)this->m_pFileBlk, this != (ON_Workspace *)0x0) {
      if ((FILE *)this->m_pMemBlk == pFile) {
        this->m_pMemBlk = (ON_Workspace_MBLK *)0x0;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_Workspace::KeepFile( FILE* pFile )
{
  bool rc = false;
  if ( pFile ) {
    struct ON_Workspace_FBLK* pFileBlk = m_pFileBlk;
    while ( pFileBlk ) {
      if ( pFileBlk->pFile == pFile ) {
        pFileBlk->pFile = nullptr;
        rc = true;
        break;
      }
      pFileBlk = pFileBlk->pNext;
    }
  }
  return rc;
}